

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O3

string * __thiscall
pbrt::LightBVHNode::ToString_abi_cxx11_(string *__return_storage_ptr__,LightBVHNode *this)

{
  anon_struct_4_2_cf919bac_for_LightBVHNode_1 aVar1;
  uint local_20;
  uint local_1c;
  
  aVar1 = this->field_1;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_20 = (uint)aVar1 >> 0x1f;
  local_1c = (uint)aVar1 & 0x7fffffff;
  detail::
  stringPrintfRecursive<pbrt::CompactLightBounds_const&,unsigned_int_const&,unsigned_int_const&>
            (__return_storage_ptr__,
             "[ LightBVHNode lightBounds: %s childOrLightIndex: %d isLeaf: %d ]",&this->lightBounds,
             &local_1c,&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string LightBVHNode::ToString() const {
    return StringPrintf(
        "[ LightBVHNode lightBounds: %s childOrLightIndex: %d isLeaf: %d ]", lightBounds,
        childOrLightIndex, isLeaf);
}